

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_parameter_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundParameterExpression::Copy(BoundParameterExpression *this)

{
  BoundParameterExpression *this_00;
  pointer pBVar1;
  pointer *__ptr;
  pointer in_RSI;
  _Head_base<0UL,_duckdb::BoundParameterExpression_*,_false> local_28;
  
  this_00 = (BoundParameterExpression *)operator_new(0x88);
  BoundParameterExpression(this_00,&in_RSI->identifier);
  local_28._M_head_impl = this_00;
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)&local_28);
  shared_ptr<duckdb::BoundParameterData,_true>::operator=
            (&pBVar1->parameter_data,&in_RSI->parameter_data);
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)&local_28);
  if (pBVar1 != in_RSI) {
    (pBVar1->super_Expression).return_type.id_ = (in_RSI->super_Expression).return_type.id_;
    (pBVar1->super_Expression).return_type.physical_type_ =
         (in_RSI->super_Expression).return_type.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(pBVar1->super_Expression).return_type.type_info_,
               &(in_RSI->super_Expression).return_type.type_info_);
  }
  pBVar1 = unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundParameterExpression,_std::default_delete<duckdb::BoundParameterExpression>,_true>
                         *)&local_28);
  Expression::CopyProperties(&pBVar1->super_Expression,&in_RSI->super_Expression);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundParameterExpression::Copy() const {
	auto result = make_uniq<BoundParameterExpression>(identifier);
	result->parameter_data = parameter_data;
	result->return_type = return_type;
	result->CopyProperties(*this);
	return std::move(result);
}